

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellKirchhoff.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityKirchhoffGeneric::ComputeStress
          (ChElasticityKirchhoffGeneric *this,ChVector<double> *n,ChVector<double> *m,
          ChVector<double> *eps,ChVector<double> *kur,double z_inf,double z_sup,double angle)

{
  double *pdVar1;
  plain_array<double,_36,_1,_32> *ppVar2;
  undefined8 ***pppuVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  uint uVar7;
  Index row;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  double *pdVar11;
  double dVar12;
  double dVar14;
  undefined1 auVar13 [16];
  ChVectorN<double,_6> mstrain;
  type tmp;
  ChVectorN<double,_6> mstress;
  double local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined8 ****local_a8 [6];
  undefined8 local_78;
  undefined8 ***local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 **ppuStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar7 = -((uint)((ulong)&local_d8 >> 3) & 0x1fffffff) & 6;
  uVar9 = 3;
  if (uVar7 < 3) {
    uVar9 = uVar7;
  }
  if (uVar7 != 0) {
    memcpy(&local_d8,eps,(ulong)(uVar9 * 8));
  }
  if (uVar9 != 3) {
    uVar10 = (ulong)(uVar9 << 3);
    memcpy((void *)((long)&local_d8 + uVar10),(void *)((long)eps->m_data + uVar10),0x18 - uVar10);
  }
  memcpy(&dStack_c0,kur,0);
  memcpy(&dStack_c0,kur,0x18);
  pdVar11 = (this->mE).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data
            .array + 4;
  lVar8 = 0;
  do {
    pdVar1 = pdVar11 + -2;
    pdVar4 = pdVar11 + -1;
    dVar12 = *pdVar11;
    pdVar5 = pdVar11 + 1;
    ppVar2 = (plain_array<double,_36,_1,_32> *)(pdVar11 + -4);
    pdVar6 = pdVar11 + -3;
    pdVar11 = pdVar11 + 6;
    dVar12 = local_d8 * ppVar2->array[0] + local_c8 * *pdVar1 + local_b8 * dVar12;
    dVar14 = dStack_d0 * *pdVar6 + dStack_c0 * *pdVar4 + dStack_b0 * *pdVar5;
    auVar13._0_8_ = dVar12 + dVar14;
    auVar13._8_8_ = dVar12 + dVar14;
    pppuVar3 = (undefined8 ***)vmovlpd_avx(auVar13);
    local_a8[lVar8] = (undefined8 ****)pppuVar3;
    uStack_48 = local_a8[4];
    uStack_60 = local_a8[1];
    lVar8 = lVar8 + 1;
  } while (lVar8 != 6);
  local_a8[1] = (undefined8 ****)0x3;
  local_a8[4] = (undefined8 ****)0x0;
  local_78 = 6;
  local_68 = local_a8[0];
  local_58 = local_a8[2];
  ppuStack_50 = local_a8[3];
  uStack_40 = local_a8[5];
  local_a8[0] = &local_68;
  local_a8[3] = &local_68;
  ChVector<double>::operator=
            (n,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               local_a8);
  local_a8[0] = (undefined8 ****)&ppuStack_50;
  local_a8[1] = (undefined8 ****)0x3;
  local_a8[4] = (undefined8 ****)0x3;
  local_78 = 6;
  local_a8[3] = &local_68;
  ChVector<double>::operator=
            (m,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)
               local_a8);
  return;
}

Assistant:

void ChElasticityKirchhoffGeneric::ComputeStress(
	ChVector<>& n,            ///< forces  n_11, n_22, n_12 (per unit length)
	ChVector<>& m,            ///< torques m_11, m_22, m_12 (per unit length)
	const ChVector<>& eps,    ///< strains   e_11, e_22, e_12
	const ChVector<>& kur,    ///< curvature k_11, k_22, k_12
	const double z_inf,       ///< layer lower z value (along thickness coord)
	const double z_sup,       ///< layer upper z value (along thickness coord)
	const double angle        ///< layer angle respect to x (if needed) -not used in this, isotropic
) {
	ChVectorN<double, 6> mstrain;
    ChVectorN<double, 6> mstress;
    mstrain.segment(0 , 3) = eps.eigen();
    mstrain.segment(3 , 3) = kur.eigen();
    mstress = this->mE * mstrain;
    n = mstress.segment(0, 3);
    m = mstress.segment(3, 3);
}